

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void free_define(Context_conflict1 *ctx,Define *def)

{
  int local_1c;
  int i;
  Define *def_local;
  Context_conflict1 *ctx_local;
  
  if (def != (Define *)0x0) {
    for (local_1c = 0; local_1c < def->paramcount; local_1c = local_1c + 1) {
      Free(ctx,def->parameters[local_1c]);
    }
    Free(ctx,def->parameters);
    Free(ctx,def->identifier);
    Free(ctx,def->definition);
    Free(ctx,def->original);
    put_define(ctx,def);
  }
  return;
}

Assistant:

static void free_define(Context *ctx, Define *def)
{
    if (def != NULL)
    {
        int i;
        for (i = 0; i < def->paramcount; i++)
            Free(ctx, (void *) def->parameters[i]);
        Free(ctx, (void *) def->parameters);
        Free(ctx, (void *) def->identifier);
        Free(ctx, (void *) def->definition);
        Free(ctx, (void *) def->original);
        put_define(ctx, def);
    } // if
}